

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int finishpcall(lua_State *L,int status,lua_KContext extra)

{
  int iVar1;
  lua_KContext extra_local;
  int status_local;
  lua_State *L_local;
  
  if ((status == 0) || (status == 1)) {
    iVar1 = lua_gettop(L);
    L_local._4_4_ = iVar1 - (int)extra;
  }
  else {
    lua_pushboolean(L,0);
    lua_pushvalue(L,-2);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int finishpcall (lua_State *L, int status, lua_KContext extra) {
  if (status != LUA_OK && status != LUA_YIELD) {  /* error? */
    lua_pushboolean(L, 0);  /* first result (false) */
    lua_pushvalue(L, -2);  /* error message */
    return 2;  /* return false, msg */
  }
  else
    return lua_gettop(L) - (int)extra;  /* return all results */
}